

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

DebuggerScope * __thiscall
Js::DebuggerScope::GetSiblingScope(DebuggerScope *this,RegSlot location,FunctionBody *functionBody)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  DebuggerScope *pDVar4;
  undefined4 *puVar5;
  
  TVar1 = this->scopeType;
  if ((DiagBlockScopeInObject < TVar1) || ((0xd8U >> (TVar1 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x165a,"(isBlockSlotOrObject || isCatchSlotOrObject)",
                                "isBlockSlotOrObject || isCatchSlotOrObject");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pDVar4 = (this->siblingScope).ptr;
  if (pDVar4 == (DebuggerScope *)0x0) {
    pDVar4 = FunctionBody::RecordStartScopeObject
                       (functionBody,
                        (uint)((TVar1 & ~DiagWithScope) == DiagBlockScopeInSlot) * 3 +
                        DiagCatchScopeDirect,(this->range).begin,location,(int *)0x0);
    Memory::WriteBarrierPtr<Js::DebuggerScope>::WriteBarrierSet(&this->siblingScope,pDVar4);
    pDVar4 = (this->siblingScope).ptr;
  }
  return pDVar4;
}

Assistant:

DebuggerScope * DebuggerScope::GetSiblingScope(RegSlot location, FunctionBody *functionBody)
    {
        bool isBlockSlotOrObject = scopeType == Js::DiagExtraScopesType::DiagBlockScopeInSlot || scopeType == Js::DiagExtraScopesType::DiagBlockScopeInObject;
        bool isCatchSlotOrObject = scopeType == Js::DiagExtraScopesType::DiagCatchScopeInSlot || scopeType == Js::DiagExtraScopesType::DiagCatchScopeInObject;

        // This is expected to be called only when the current scope is either slot or activation object.
        Assert(isBlockSlotOrObject || isCatchSlotOrObject);

        if (siblingScope == nullptr)
        {
            // If the sibling isn't there, attempt to retrieve it if we're reparsing or create it anew if this is the first parse.
            siblingScope = functionBody->RecordStartScopeObject(isBlockSlotOrObject ? Js::DiagExtraScopesType::DiagBlockScopeDirect : Js::DiagExtraScopesType::DiagCatchScopeDirect, GetStart(), location);
        }

        return siblingScope;
    }